

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshio.cpp
# Opt level: O2

void geometrycentral::surface::writeSurfaceMesh
               (SurfaceMesh *mesh,EmbeddedGeometryInterface *geometry,ostream *out,string *type)

{
  SimplePolygonMesh simpleMesh;
  _Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> _Stack_b8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_a0;
  string local_88;
  SimplePolygonMesh local_68;
  
  SurfaceMesh::getFaceVertexList(&local_a0,mesh);
  anon_unknown_18::geometryToStdVector
            ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
             &_Stack_b8,mesh,geometry);
  SimplePolygonMesh::SimplePolygonMesh
            (&local_68,
             (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_a0,
             (vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
             &_Stack_b8);
  ::std::_Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::
  ~_Vector_base(&_Stack_b8);
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0);
  ::std::__cxx11::string::string((string *)&local_88,(string *)type);
  SimplePolygonMesh::writeMesh(&local_68,(ostream *)out,&local_88);
  ::std::__cxx11::string::~string((string *)&local_88);
  SimplePolygonMesh::~SimplePolygonMesh(&local_68);
  return;
}

Assistant:

void writeSurfaceMesh(SurfaceMesh& mesh, EmbeddedGeometryInterface& geometry, std::ostream& out, std::string type) {
  SimplePolygonMesh simpleMesh(mesh.getFaceVertexList(), geometryToStdVector(mesh, geometry));
  simpleMesh.writeMesh(out, type);
}